

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsEnableRuntimeExecution(JsRuntimeHandle runtimeHandle)

{
  ThreadContext *this;
  bool bVar1;
  JsrtRuntime *pJVar2;
  JsErrorCode JVar3;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    pJVar2 = JsrtRuntime::FromHandle(runtimeHandle);
    this = pJVar2->threadContext;
    bVar1 = ThreadContext::TestThreadContextFlag(this,ThreadContextFlagCanDisableExecution);
    JVar3 = JsNoError;
    if (bVar1) {
      if (this->recycler != (Recycler *)0x0) {
        bVar1 = Memory::Recycler::IsHeapEnumInProgress(this->recycler);
        JVar3 = JsErrorHeapEnumInProgress;
        if (bVar1) goto LAB_00372603;
      }
      JVar3 = JsErrorInThreadServiceCallback;
      if ((this->threadService).isInCallback == false) {
        ThreadContextScope::ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,this);
        JVar3 = JsErrorWrongThread;
        if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
          JVar3 = JsNoError;
          ThreadContext::EnableExecution(this);
        }
        ThreadContextScope::~ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
      }
    }
  }
LAB_00372603:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsEnableRuntimeExecution(_In_ JsRuntimeHandle runtimeHandle)
{
    return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        if (!threadContext->TestThreadContextFlag(ThreadContextFlagCanDisableExecution))
        {
            return JsNoError;
        }

        if (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        threadContext->EnableExecution();
        return JsNoError;
    });
}